

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_get_received_message_id(LINK_HANDLE link,delivery_number *message_id)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  delivery_number *message_id_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_get_received_message_id",0x622,1,"NULL link");
    }
    l._4_4_ = 0x623;
  }
  else {
    *message_id = link->received_delivery_id;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int link_get_received_message_id(LINK_HANDLE link, delivery_number* message_id)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        *message_id = link->received_delivery_id;
        result = 0;
    }

    return result;
}